

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlRegPrintAtom(FILE *output,xmlRegAtomPtr atom)

{
  int local_1c;
  int i;
  xmlRegAtomPtr atom_local;
  FILE *output_local;
  
  fprintf((FILE *)output," atom: ");
  if (atom == (xmlRegAtomPtr)0x0) {
    fprintf((FILE *)output,"NULL\n");
  }
  else {
    if (atom->neg != 0) {
      fprintf((FILE *)output,"not ");
    }
    xmlRegPrintAtomType(output,atom->type);
    xmlRegPrintQuantType(output,atom->quant);
    if (atom->quant == XML_REGEXP_QUANT_RANGE) {
      fprintf((FILE *)output,"%d-%d ",(ulong)(uint)atom->min,(ulong)(uint)atom->max);
    }
    if (atom->type == XML_REGEXP_STRING) {
      fprintf((FILE *)output,"\'%s\' ",atom->valuep);
    }
    if (atom->type == XML_REGEXP_CHARVAL) {
      fprintf((FILE *)output,"char %c\n",(ulong)(uint)atom->codepoint);
    }
    else if (atom->type == XML_REGEXP_RANGES) {
      fprintf((FILE *)output,"%d entries\n",(ulong)(uint)atom->nbRanges);
      for (local_1c = 0; local_1c < atom->nbRanges; local_1c = local_1c + 1) {
        xmlRegPrintRange(output,atom->ranges[local_1c]);
      }
    }
    else if (atom->type == XML_REGEXP_SUBREG) {
      fprintf((FILE *)output,"start %d end %d\n",(ulong)(uint)atom->start->no,
              (ulong)(uint)atom->stop->no);
    }
    else {
      fprintf((FILE *)output,"\n");
    }
  }
  return;
}

Assistant:

static void
xmlRegPrintAtom(FILE *output, xmlRegAtomPtr atom) {
    fprintf(output, " atom: ");
    if (atom == NULL) {
	fprintf(output, "NULL\n");
	return;
    }
    if (atom->neg)
        fprintf(output, "not ");
    xmlRegPrintAtomType(output, atom->type);
    xmlRegPrintQuantType(output, atom->quant);
    if (atom->quant == XML_REGEXP_QUANT_RANGE)
	fprintf(output, "%d-%d ", atom->min, atom->max);
    if (atom->type == XML_REGEXP_STRING)
	fprintf(output, "'%s' ", (char *) atom->valuep);
    if (atom->type == XML_REGEXP_CHARVAL)
	fprintf(output, "char %c\n", atom->codepoint);
    else if (atom->type == XML_REGEXP_RANGES) {
	int i;
	fprintf(output, "%d entries\n", atom->nbRanges);
	for (i = 0; i < atom->nbRanges;i++)
	    xmlRegPrintRange(output, atom->ranges[i]);
    } else if (atom->type == XML_REGEXP_SUBREG) {
	fprintf(output, "start %d end %d\n", atom->start->no, atom->stop->no);
    } else {
	fprintf(output, "\n");
    }
}